

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

difference_type
QtPrivate::sequential_erase_with_copy<QList<QString>,QString>(QList<QString> *c,QString *t)

{
  long lVar1;
  difference_type dVar2;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  QList<QString> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  dVar2 = sequential_erase<QList<QString>,QString>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QString::~QString((QString *)0x2b544e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

auto sequential_erase_with_copy(Container &c, const T &t)
{
    using CopyProxy = std::conditional_t<std::is_copy_constructible_v<T>, T, const T &>;
    return sequential_erase(c, CopyProxy(t));
}